

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_point_cmp(mbedtls_ecp_point *P,mbedtls_ecp_point *Q)

{
  int iVar1;
  mbedtls_ecp_point *Q_local;
  mbedtls_ecp_point *P_local;
  
  iVar1 = mbedtls_mpi_cmp_mpi(&P->X,&Q->X);
  if (((iVar1 == 0) && (iVar1 = mbedtls_mpi_cmp_mpi(&P->Y,&Q->Y), iVar1 == 0)) &&
     (iVar1 = mbedtls_mpi_cmp_mpi(&P->Z,&Q->Z), iVar1 == 0)) {
    return 0;
  }
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_point_cmp( const mbedtls_ecp_point *P,
                           const mbedtls_ecp_point *Q )
{
    if( mbedtls_mpi_cmp_mpi( &P->X, &Q->X ) == 0 &&
        mbedtls_mpi_cmp_mpi( &P->Y, &Q->Y ) == 0 &&
        mbedtls_mpi_cmp_mpi( &P->Z, &Q->Z ) == 0 )
    {
        return( 0 );
    }

    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}